

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZStack<int,_10>,_10>::Resize
          (TPZManVector<TPZStack<int,_10>,_10> *this,int64_t newsize)

{
  TPZStack<int,_10> *pTVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *puVar4;
  TPZStack<int,_10> *pTVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  
  if (-1 < newsize) {
    if ((this->super_TPZVec<TPZStack<int,_10>_>).fNElements != newsize) {
      lVar7 = (this->super_TPZVec<TPZStack<int,_10>_>).fNAlloc;
      if (lVar7 < newsize) {
        if (newsize < 0xb) {
          pTVar1 = this->fExtAlloc;
          if ((this->super_TPZVec<TPZStack<int,_10>_>).fStore != pTVar1) {
            if (0 < (this->super_TPZVec<TPZStack<int,_10>_>).fNElements) {
              lVar8 = 0;
              lVar7 = 0;
              do {
                TPZManVector<int,_10>::operator=
                          ((TPZManVector<int,_10> *)
                           ((long)(pTVar1->super_TPZManVector<int,_10>).fExtAlloc + lVar8 + -0x20),
                           (TPZManVector<int,_10> *)
                           ((long)(((this->super_TPZVec<TPZStack<int,_10>_>).fStore)->
                                  super_TPZManVector<int,_10>).fExtAlloc + lVar8 + -0x20));
                lVar7 = lVar7 + 1;
                lVar8 = lVar8 + 0x48;
              } while (lVar7 < (this->super_TPZVec<TPZStack<int,_10>_>).fNElements);
            }
            pTVar5 = (this->super_TPZVec<TPZStack<int,_10>_>).fStore;
            if (pTVar5 != (TPZStack<int,_10> *)0x0) {
              lVar7 = *(long *)(pTVar5[-1].super_TPZManVector<int,_10>.fExtAlloc + 8);
              if (lVar7 != 0) {
                lVar8 = lVar7 * 0x48;
                do {
                  TPZManVector<int,_10>::~TPZManVector
                            ((TPZManVector<int,_10> *)
                             ((long)pTVar5[-1].super_TPZManVector<int,_10>.fExtAlloc + lVar8 + -0x20
                             ));
                  lVar8 = lVar8 + -0x48;
                } while (lVar8 != 0);
              }
              operator_delete__(pTVar5[-1].super_TPZManVector<int,_10>.fExtAlloc + 8,
                                lVar7 * 0x48 + 8);
            }
            (this->super_TPZVec<TPZStack<int,_10>_>).fStore = pTVar1;
          }
          (this->super_TPZVec<TPZStack<int,_10>_>).fNElements = newsize;
          (this->super_TPZVec<TPZStack<int,_10>_>).fNAlloc = 0;
        }
        else {
          dVar10 = (double)lVar7 * 1.2;
          uVar9 = (long)dVar10;
          if (dVar10 < (double)newsize) {
            uVar9 = newsize;
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar9;
          uVar3 = SUB168(auVar2 * ZEXT816(0x48),0);
          uVar6 = uVar3 + 8;
          if (0xfffffffffffffff7 < uVar3) {
            uVar6 = 0xffffffffffffffff;
          }
          if (SUB168(auVar2 * ZEXT816(0x48),8) != 0) {
            uVar6 = 0xffffffffffffffff;
          }
          puVar4 = (ulong *)operator_new__(uVar6);
          *puVar4 = uVar9;
          pTVar1 = (TPZStack<int,_10> *)(puVar4 + 1);
          if (uVar9 != 0) {
            lVar7 = 0;
            pTVar5 = pTVar1;
            do {
              TPZStack<int,_10>::TPZStack(pTVar5);
              lVar7 = lVar7 + -0x48;
              pTVar5 = pTVar5 + 1;
            } while (-lVar7 != uVar9 * 0x48);
          }
          if (0 < (this->super_TPZVec<TPZStack<int,_10>_>).fNElements) {
            lVar8 = 0;
            lVar7 = 0;
            do {
              TPZManVector<int,_10>::operator=
                        ((TPZManVector<int,_10> *)
                         ((long)(pTVar1->super_TPZManVector<int,_10>).fExtAlloc + lVar8 + -0x20),
                         (TPZManVector<int,_10> *)
                         ((long)(((this->super_TPZVec<TPZStack<int,_10>_>).fStore)->
                                super_TPZManVector<int,_10>).fExtAlloc + lVar8 + -0x20));
              lVar7 = lVar7 + 1;
              lVar8 = lVar8 + 0x48;
            } while (lVar7 < (this->super_TPZVec<TPZStack<int,_10>_>).fNElements);
          }
          pTVar5 = (this->super_TPZVec<TPZStack<int,_10>_>).fStore;
          if (pTVar5 != (TPZStack<int,_10> *)0x0 && pTVar5 != this->fExtAlloc) {
            lVar7 = *(long *)(pTVar5[-1].super_TPZManVector<int,_10>.fExtAlloc + 8);
            if (lVar7 != 0) {
              lVar8 = lVar7 * 0x48;
              do {
                TPZManVector<int,_10>::~TPZManVector
                          ((TPZManVector<int,_10> *)
                           ((long)pTVar5[-1].super_TPZManVector<int,_10>.fExtAlloc + lVar8 + -0x20))
                ;
                lVar8 = lVar8 + -0x48;
              } while (lVar8 != 0);
            }
            operator_delete__(pTVar5[-1].super_TPZManVector<int,_10>.fExtAlloc + 8,lVar7 * 0x48 + 8)
            ;
          }
          (this->super_TPZVec<TPZStack<int,_10>_>).fStore = pTVar1;
          (this->super_TPZVec<TPZStack<int,_10>_>).fNElements = newsize;
          (this->super_TPZVec<TPZStack<int,_10>_>).fNAlloc = uVar9;
        }
      }
      else {
        (this->super_TPZVec<TPZStack<int,_10>_>).fNElements = newsize;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}